

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

Curl_ssl_scache * cf_ssl_scache_get(Curl_easy *data)

{
  Curl_easy *local_20;
  Curl_ssl_scache *scache;
  Curl_easy *data_local;
  
  local_20 = (Curl_easy *)0x0;
  if ((data->share == (Curl_share *)0x0) || (data->share->ssl_scache == (Curl_ssl_scache *)0x0)) {
    if ((data->multi != (Curl_multi *)0x0) && (data->multi->ssl_scache != (Curl_ssl_scache *)0x0)) {
      local_20 = (Curl_easy *)data->multi->ssl_scache;
    }
  }
  else {
    local_20 = (Curl_easy *)data->share->ssl_scache;
  }
  if ((local_20 == (Curl_easy *)0x0) ||
     ((local_20 != (Curl_easy *)0x0 && (local_20->magic == 0xe1551)))) {
    data_local = local_20;
  }
  else {
    Curl_failf(data,"transfer would use an invalid scache at %p, denied",local_20);
    data_local = (Curl_easy *)0x0;
  }
  return (Curl_ssl_scache *)data_local;
}

Assistant:

static struct Curl_ssl_scache *cf_ssl_scache_get(struct Curl_easy *data)
{
  struct Curl_ssl_scache *scache = NULL;
  /* If a share is present, its ssl_scache has preference over the multi */
  if(data->share && data->share->ssl_scache)
    scache = data->share->ssl_scache;
  else if(data->multi && data->multi->ssl_scache)
    scache = data->multi->ssl_scache;
  if(scache && !GOOD_SCACHE(scache)) {
    failf(data, "transfer would use an invalid scache at %p, denied",
          (void *)scache);
    DEBUGASSERT(0);
    return NULL;
  }
  return scache;
}